

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

int AndersonAcc(KINMem kin_mem,N_Vector gval,N_Vector fv,N_Vector x,N_Vector xold,long iter,
               sunrealtype *R,sunrealtype *gamma)

{
  double dVar1;
  double dVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  ulong in_R9;
  double dVar9;
  double dVar10;
  double *in_stack_00000008;
  long in_stack_00000010;
  N_Vector *Xv;
  sunrealtype *cv;
  int nvec;
  int dotprodSB;
  sunrealtype s;
  sunrealtype c;
  sunrealtype temp;
  sunrealtype b;
  sunrealtype a;
  sunrealtype onembeta;
  sunrealtype alfa;
  long *ipt_map;
  long lAA;
  long j;
  long i;
  long i_pt;
  int retval;
  double local_d0;
  double local_c8;
  int local_a8;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  int local_4;
  
  bVar6 = false;
  puVar3 = *(undefined8 **)(in_RDI + 0x1f0);
  puVar4 = *(undefined8 **)(in_RDI + 0x1f8);
  if (((*(long *)(*(long *)(*(long *)(in_RDI + 0x150) + 8) + 0x140) != 0) ||
      (*(long *)(*(long *)(*(long *)(in_RDI + 0x150) + 8) + 0x188) != 0)) &&
     (*(long *)(*(long *)(*(long *)(in_RDI + 0x150) + 8) + 400) != 0)) {
    bVar6 = true;
  }
  puVar5 = *(undefined8 **)(in_RDI + 0x1b8);
  lVar8 = (in_R9 - 1) - ((long)(in_R9 - 1) / *(long *)(in_RDI + 0x1c0)) * *(long *)(in_RDI + 0x1c0);
  N_VLinearSum(0x3ff0000000000000,&DAT_bff0000000000000,in_RSI,in_R8,in_RDX);
  if (0 < (long)in_R9) {
    N_VLinearSum(0x3ff0000000000000,&DAT_bff0000000000000,in_RSI,*(undefined8 *)(in_RDI + 0x178),
                 *(undefined8 *)(*(long *)(in_RDI + 0x188) + lVar8 * 8));
    N_VLinearSum(0x3ff0000000000000,&DAT_bff0000000000000,in_RDX,*(undefined8 *)(in_RDI + 0x170),
                 *(undefined8 *)(*(long *)(in_RDI + 0x180) + lVar8 * 8));
  }
  N_VScale(0x3ff0000000000000,in_RSI,*(undefined8 *)(in_RDI + 0x178));
  N_VScale(0x3ff0000000000000,in_RDX,*(undefined8 *)(in_RDI + 0x170));
  if (in_R9 == 0) {
    if (*(int *)(in_RDI + 0x1e8) == 0) {
      N_VScale(0x3ff0000000000000,in_RSI,in_RCX);
    }
    else {
      N_VLinearSum(1.0 - *(double *)(in_RDI + 0x168),*(undefined8 *)(in_RDI + 0x198),in_R8,in_RSI,
                   in_RCX);
    }
    local_4 = 0;
  }
  else {
    if (in_R9 == 1) {
      dVar9 = (double)N_VDotProd(*(undefined8 *)(*(long *)(in_RDI + 0x180) + lVar8 * 8),
                                 *(undefined8 *)(*(long *)(in_RDI + 0x180) + lVar8 * 8));
      if (0.0 < dVar9) {
        dVar9 = (double)N_VDotProd(*(undefined8 *)(*(long *)(in_RDI + 0x180) + lVar8 * 8),
                                   *(undefined8 *)(*(long *)(in_RDI + 0x180) + lVar8 * 8));
        local_c8 = sqrt(dVar9);
      }
      else {
        local_c8 = 0.0;
      }
      *in_stack_00000008 = local_c8;
      N_VScale(1.0 / *in_stack_00000008,*(undefined8 *)(*(long *)(in_RDI + 0x180) + lVar8 * 8),
               *(undefined8 *)(*(long *)(in_RDI + 400) + lVar8 * 8));
      *puVar5 = 0;
    }
    else if (*(long *)(in_RDI + 0x1c0) < (long)in_R9) {
      for (local_50 = 0; (long)local_50 < *(long *)(in_RDI + 0x1c0) + -1; local_50 = local_50 + 1) {
        dVar9 = in_stack_00000008[(local_50 + 1) * *(long *)(in_RDI + 0x1c0) + local_50];
        dVar10 = in_stack_00000008[(local_50 + 1) * *(long *)(in_RDI + 0x1c0) + local_50 + 1];
        if (0.0 < dVar9 * dVar9 + dVar10 * dVar10) {
          local_d0 = sqrt(dVar9 * dVar9 + dVar10 * dVar10);
        }
        else {
          local_d0 = 0.0;
        }
        dVar9 = dVar9 / local_d0;
        dVar10 = dVar10 / local_d0;
        in_stack_00000008[(local_50 + 1) * *(long *)(in_RDI + 0x1c0) + local_50] = local_d0;
        in_stack_00000008[(local_50 + 1) * *(long *)(in_RDI + 0x1c0) + local_50 + 1] = 0.0;
        if ((long)local_50 < *(long *)(in_RDI + 0x1c0) + -1) {
          for (local_58 = local_50 + 2; (long)local_58 < *(long *)(in_RDI + 0x1c0);
              local_58 = local_58 + 1) {
            dVar1 = in_stack_00000008[local_58 * *(long *)(in_RDI + 0x1c0) + local_50];
            dVar2 = in_stack_00000008[local_58 * *(long *)(in_RDI + 0x1c0) + local_50 + 1];
            in_stack_00000008[local_58 * *(long *)(in_RDI + 0x1c0) + local_50 + 1] =
                 -dVar10 * dVar1 + dVar9 * dVar2;
            in_stack_00000008[local_58 * *(long *)(in_RDI + 0x1c0) + local_50] =
                 dVar9 * dVar1 + dVar10 * dVar2;
          }
        }
        N_VLinearSum(dVar9,dVar10,*(undefined8 *)(*(long *)(in_RDI + 400) + local_50 * 8),
                     *(undefined8 *)(*(long *)(in_RDI + 400) + 8 + local_50 * 8),
                     *(undefined8 *)(in_RDI + 0x150));
        N_VLinearSum(-dVar10,dVar9,*(undefined8 *)(*(long *)(in_RDI + 400) + local_50 * 8),
                     *(undefined8 *)(*(long *)(in_RDI + 400) + 8 + local_50 * 8),
                     *(undefined8 *)(*(long *)(in_RDI + 400) + 8 + local_50 * 8));
        N_VScale(0x3ff0000000000000,*(undefined8 *)(in_RDI + 0x150),
                 *(undefined8 *)(*(long *)(in_RDI + 400) + local_50 * 8));
      }
      for (local_50 = 1; (long)local_50 < *(long *)(in_RDI + 0x1c0); local_50 = local_50 + 1) {
        for (local_58 = 0; (long)local_58 < *(long *)(in_RDI + 0x1c0) + -1; local_58 = local_58 + 1)
        {
          in_stack_00000008[(local_50 + -1) * *(long *)(in_RDI + 0x1c0) + local_58] =
               in_stack_00000008[local_50 * *(long *)(in_RDI + 0x1c0) + local_58];
        }
      }
      if (*(int *)(in_RDI + 0x1d0) == 1) {
        if (bVar6) {
          if (1 < (long)local_50) {
            for (local_50 = 2; (long)local_50 < *(long *)(in_RDI + 0x1c0); local_50 = local_50 + 1)
            {
              N_VDotProdMultiLocal
                        (local_50 & 0xffffffff,
                         *(undefined8 *)(*(long *)(in_RDI + 400) + (local_50 - 1) * 8),
                         *(undefined8 *)(in_RDI + 400),
                         *(long *)(in_RDI + 0x1b0) + (local_50 - 1) * *(long *)(in_RDI + 0x1c0) * 8)
              ;
            }
            N_VDotProdMultiAllReduce
                      ((int)*(undefined8 *)(in_RDI + 0x1c0) * (int)*(undefined8 *)(in_RDI + 0x1c0),
                       *(undefined8 *)(*(long *)(in_RDI + 400) + (local_50 - 1) * 8),
                       *(undefined8 *)(in_RDI + 0x1b0));
          }
          for (local_50 = 1; (long)local_50 < *(long *)(in_RDI + 0x1c0); local_50 = local_50 + 1) {
            *(undefined8 *)
             (*(long *)(in_RDI + 0x1b0) +
             ((local_50 + -1) * *(long *)(in_RDI + 0x1c0) + local_50 + -1) * 8) = 0x3ff0000000000000
            ;
          }
        }
        else {
          **(undefined8 **)(in_RDI + 0x1b0) = 0x3ff0000000000000;
          for (local_50 = 2; (long)local_50 < *(long *)(in_RDI + 0x1c0); local_50 = local_50 + 1) {
            N_VDotProdMulti((int)local_50 + -1,
                            *(undefined8 *)(*(long *)(in_RDI + 400) + (local_50 + -1) * 8),
                            *(undefined8 *)(in_RDI + 400),
                            *(long *)(in_RDI + 0x1b0) +
                            (local_50 + -1) * *(long *)(in_RDI + 0x1c0) * 8);
            *(undefined8 *)
             (*(long *)(in_RDI + 0x1b0) +
             ((local_50 + -1) * *(long *)(in_RDI + 0x1c0) + local_50 + -1) * 8) = 0x3ff0000000000000
            ;
          }
        }
      }
      (**(code **)(in_RDI + 0x1d8))
                (*(undefined8 *)(in_RDI + 400),in_stack_00000008,
                 *(undefined8 *)(*(long *)(in_RDI + 0x180) + lVar8 * 8),
                 (int)*(undefined8 *)(in_RDI + 0x1c0) + -1,*(undefined8 *)(in_RDI + 0x1c0),
                 *(undefined8 *)(in_RDI + 0x1e0));
      local_58 = 0;
      local_50 = lVar8;
      while (local_50 = local_50 + 1, (long)local_50 < *(long *)(in_RDI + 0x1c0)) {
        puVar5[local_58] = local_50;
        local_58 = local_58 + 1;
      }
      for (local_50 = 0; (long)local_50 < lVar8 + 1; local_50 = local_50 + 1) {
        puVar5[local_58] = local_50;
        local_58 = local_58 + 1;
      }
    }
    else {
      (**(code **)(in_RDI + 0x1d8))
                (*(undefined8 *)(in_RDI + 400),in_stack_00000008,
                 *(undefined8 *)(*(long *)(in_RDI + 0x180) + lVar8 * 8),(int)in_R9 + -1,
                 *(undefined8 *)(in_RDI + 0x1c0),*(undefined8 *)(in_RDI + 0x1e0));
      for (local_58 = 0; (long)local_58 < (long)in_R9; local_58 = local_58 + 1) {
        puVar5[local_58] = local_58;
      }
    }
    local_60 = in_R9;
    if (*(long *)(in_RDI + 0x1c0) < (long)in_R9) {
      local_60 = *(ulong *)(in_RDI + 0x1c0);
    }
    iVar7 = N_VDotProdMulti(local_60 & 0xffffffff,in_RDX,*(undefined8 *)(in_RDI + 400),
                            in_stack_00000010);
    if (iVar7 == 0) {
      *puVar3 = 0x3ff0000000000000;
      *puVar4 = in_RSI;
      local_a8 = 1;
      local_58 = local_60;
      while (local_50 = local_58 - 1, -1 < (long)local_50) {
        for (; (long)local_58 < (long)local_60; local_58 = local_58 + 1) {
          *(double *)(in_stack_00000010 + local_50 * 8) =
               -in_stack_00000008[local_58 * *(long *)(in_RDI + 0x1c0) + local_50] *
               *(double *)(in_stack_00000010 + local_58 * 8) +
               *(double *)(in_stack_00000010 + local_50 * 8);
        }
        *(double *)(in_stack_00000010 + local_50 * 8) =
             *(double *)(in_stack_00000010 + local_50 * 8) /
             in_stack_00000008[local_50 * *(long *)(in_RDI + 0x1c0) + local_50];
        puVar3[local_a8] = *(ulong *)(in_stack_00000010 + local_50 * 8) ^ 0x8000000000000000;
        puVar4[local_a8] = *(undefined8 *)(*(long *)(in_RDI + 0x188) + puVar5[local_50] * 8);
        local_a8 = local_a8 + 1;
        local_58 = local_50;
      }
      if (*(int *)(in_RDI + 0x1e8) != 0) {
        dVar9 = 1.0 - *(double *)(in_RDI + 0x198);
        puVar3[local_a8] = -dVar9;
        puVar4[local_a8] = in_RDX;
        while( true ) {
          local_50 = local_60 - 1;
          local_a8 = local_a8 + 1;
          if ((long)local_50 < 0) break;
          puVar3[local_a8] = dVar9 * *(double *)(in_stack_00000010 + local_50 * 8);
          puVar4[local_a8] = *(undefined8 *)(*(long *)(in_RDI + 0x180) + puVar5[local_50] * 8);
          local_60 = local_50;
        }
      }
      iVar7 = N_VLinearCombination(local_a8,puVar3,puVar4,in_RCX);
      if (iVar7 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = -0x10;
      }
    }
    else {
      local_4 = -0x10;
    }
  }
  return local_4;
}

Assistant:

static int AndersonAcc(KINMem kin_mem, N_Vector gval, N_Vector fv, N_Vector x,
                       N_Vector xold, long int iter, sunrealtype* R,
                       sunrealtype* gamma)
{
  int retval;
  long int i_pt, i, j, lAA;
  long int* ipt_map;
  sunrealtype alfa;
  sunrealtype onembeta;
  sunrealtype a, b, temp, c, s;
  sunbooleantype dotprodSB = SUNFALSE;

  /* local shortcuts for fused vector operation */
  int nvec        = 0;
  sunrealtype* cv = kin_mem->kin_cv;
  N_Vector* Xv    = kin_mem->kin_Xv;

  /* local dot product flag for single buffer reductions */
  if ((kin_mem->kin_vtemp2->ops->nvdotprodlocal ||
       kin_mem->kin_vtemp2->ops->nvdotprodmultilocal) &&
      kin_mem->kin_vtemp2->ops->nvdotprodmultiallreduce)
  {
    dotprodSB = SUNTRUE;
  }

  ipt_map = kin_mem->kin_ipt_map;
  i_pt    = iter - 1 - ((iter - 1) / kin_mem->kin_m_aa) * kin_mem->kin_m_aa;
  N_VLinearSum(ONE, gval, -ONE, xold, fv);
  if (iter > 0)
  {
    /* compute dg_new = gval - gval_old */
    N_VLinearSum(ONE, gval, -ONE, kin_mem->kin_gold_aa, kin_mem->kin_dg_aa[i_pt]);
    /* compute df_new = fval - fval_old */
    N_VLinearSum(ONE, fv, -ONE, kin_mem->kin_fold_aa, kin_mem->kin_df_aa[i_pt]);
  }

  N_VScale(ONE, gval, kin_mem->kin_gold_aa);
  N_VScale(ONE, fv, kin_mem->kin_fold_aa);

  /* on first iteration, do fixed point update */
  if (iter == 0)
  {
    if (kin_mem->kin_damping_aa)
    {
      /* damped fixed point */
      N_VLinearSum((ONE - kin_mem->kin_beta), xold, kin_mem->kin_beta_aa, gval,
                   x);
    }
    else
    {
      /* standard fixed point */
      N_VScale(ONE, gval, x);
    }
    return (0);
  }

  /* update data structures based on current iteration index */

  if (iter == 1)
  {
    /* second iteration */
    R[0] =
      SUNRsqrt(N_VDotProd(kin_mem->kin_df_aa[i_pt], kin_mem->kin_df_aa[i_pt]));
    alfa = ONE / R[0];
    N_VScale(alfa, kin_mem->kin_df_aa[i_pt], kin_mem->kin_q_aa[i_pt]);
    ipt_map[0] = 0;
  }
  else if (iter <= kin_mem->kin_m_aa)
  {
    /* another iteration before we've reached maa */

    kin_mem->kin_qr_func(kin_mem->kin_q_aa, R, kin_mem->kin_df_aa[i_pt],
                         (int)iter - 1, (int)kin_mem->kin_m_aa,
                         (void*)kin_mem->kin_qr_data);

    /* update iteration map */
    for (j = 0; j < iter; j++) { ipt_map[j] = j; }
  }
  else
  {
    /* we've filled the acceleration subspace, so start recycling */

    /* Delete left-most column vector from QR factorization */
    for (i = 0; i < kin_mem->kin_m_aa - 1; i++)
    {
      a    = R[(i + 1) * kin_mem->kin_m_aa + i];
      b    = R[(i + 1) * kin_mem->kin_m_aa + i + 1];
      temp = SUNRsqrt(a * a + b * b);
      c    = a / temp;
      s    = b / temp;
      R[(i + 1) * kin_mem->kin_m_aa + i]     = temp;
      R[(i + 1) * kin_mem->kin_m_aa + i + 1] = ZERO;
      /* OK to re-use temp */
      if (i < kin_mem->kin_m_aa - 1)
      {
        for (j = i + 2; j < kin_mem->kin_m_aa; j++)
        {
          a                                = R[j * kin_mem->kin_m_aa + i];
          b                                = R[j * kin_mem->kin_m_aa + i + 1];
          temp                             = c * a + s * b;
          R[j * kin_mem->kin_m_aa + i + 1] = -s * a + c * b;
          R[j * kin_mem->kin_m_aa + i]     = temp;
        }
      }
      N_VLinearSum(c, kin_mem->kin_q_aa[i], s, kin_mem->kin_q_aa[i + 1],
                   kin_mem->kin_vtemp2);
      N_VLinearSum(-s, kin_mem->kin_q_aa[i], c, kin_mem->kin_q_aa[i + 1],
                   kin_mem->kin_q_aa[i + 1]);
      N_VScale(ONE, kin_mem->kin_vtemp2, kin_mem->kin_q_aa[i]);
    }

    /* Shift R to the left by one. */
    for (i = 1; i < kin_mem->kin_m_aa; i++)
    {
      for (j = 0; j < kin_mem->kin_m_aa - 1; j++)
      {
        R[(i - 1) * kin_mem->kin_m_aa + j] = R[i * kin_mem->kin_m_aa + j];
      }
    }

    /* If ICWY orthogonalization, then update T */
    if (kin_mem->kin_orth_aa == KIN_ORTH_ICWY)
    {
      if (dotprodSB)
      {
        if (i > 1)
        {
          for (i = 2; i < kin_mem->kin_m_aa; i++)
          {
            N_VDotProdMultiLocal((int)i, kin_mem->kin_q_aa[i - 1],
                                 kin_mem->kin_q_aa,
                                 kin_mem->kin_T_aa + (i - 1) * kin_mem->kin_m_aa);
          }
          N_VDotProdMultiAllReduce((int)(kin_mem->kin_m_aa * kin_mem->kin_m_aa),
                                   kin_mem->kin_q_aa[i - 1], kin_mem->kin_T_aa);
        }
        for (i = 1; i < kin_mem->kin_m_aa; i++)
        {
          kin_mem->kin_T_aa[(i - 1) * kin_mem->kin_m_aa + (i - 1)] = ONE;
        }
      }
      else
      {
        kin_mem->kin_T_aa[0] = ONE;
        for (i = 2; i < kin_mem->kin_m_aa; i++)
        {
          N_VDotProdMulti((int)i - 1, kin_mem->kin_q_aa[i - 1], kin_mem->kin_q_aa,
                          kin_mem->kin_T_aa + (i - 1) * kin_mem->kin_m_aa);
          kin_mem->kin_T_aa[(i - 1) * kin_mem->kin_m_aa + (i - 1)] = ONE;
        }
      }
    }

    /* Add the new df vector */
    kin_mem->kin_qr_func(kin_mem->kin_q_aa, R, kin_mem->kin_df_aa[i_pt],
                         (int)kin_mem->kin_m_aa - 1, (int)kin_mem->kin_m_aa,
                         (void*)kin_mem->kin_qr_data);

    /* Update the iteration map */
    j = 0;
    for (i = i_pt + 1; i < kin_mem->kin_m_aa; i++) { ipt_map[j++] = i; }
    for (i = 0; i < (i_pt + 1); i++) { ipt_map[j++] = i; }
  }

  /* Solve least squares problem and update solution */
  lAA = iter;
  if (kin_mem->kin_m_aa < iter) { lAA = kin_mem->kin_m_aa; }

  retval = N_VDotProdMulti((int)lAA, fv, kin_mem->kin_q_aa, gamma);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  /* set arrays for fused vector operation */
  cv[0] = ONE;
  Xv[0] = gval;
  nvec  = 1;

  for (i = lAA - 1; i > -1; i--)
  {
    for (j = i + 1; j < lAA; j++)
    {
      gamma[i] = gamma[i] - R[j * kin_mem->kin_m_aa + i] * gamma[j];
    }
    gamma[i] = gamma[i] / R[i * kin_mem->kin_m_aa + i];

    cv[nvec] = -gamma[i];
    Xv[nvec] = kin_mem->kin_dg_aa[ipt_map[i]];
    nvec += 1;
  }

  /* if enabled, apply damping */
  if (kin_mem->kin_damping_aa)
  {
    onembeta = (ONE - kin_mem->kin_beta_aa);
    cv[nvec] = -onembeta;
    Xv[nvec] = fv;
    nvec += 1;
    for (i = lAA - 1; i > -1; i--)
    {
      cv[nvec] = onembeta * gamma[i];
      Xv[nvec] = kin_mem->kin_df_aa[ipt_map[i]];
      nvec += 1;
    }
  }

  /* update solution */
  retval = N_VLinearCombination(nvec, cv, Xv, x);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  return 0;
}